

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::ExtractDebugVisitor::~ExtractDebugVisitor(ExtractDebugVisitor *this)

{
  ExtractDebugVisitor *this_local;
  
  ~ExtractDebugVisitor(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

void visit(AssignStmt *stmt) override { process_stmt(stmt); }